

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

NamedConditionalDirectiveExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::NamedConditionalDirectiveExpressionSyntax,slang::parsing::Token>
          (BumpAllocator *this,Token *args)

{
  Info *pIVar1;
  TokenKind TVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  NamedConditionalDirectiveExpressionSyntax *pNVar6;
  
  pNVar6 = (NamedConditionalDirectiveExpressionSyntax *)allocate(this,0x28,8);
  TVar2 = args->kind;
  uVar3 = args->field_0x2;
  NVar4.raw = (args->numFlags).raw;
  uVar5 = args->rawLen;
  pIVar1 = args->info;
  (pNVar6->super_ConditionalDirectiveExpressionSyntax).super_SyntaxNode.kind =
       NamedConditionalDirectiveExpression;
  (pNVar6->super_ConditionalDirectiveExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pNVar6->super_ConditionalDirectiveExpressionSyntax).super_SyntaxNode.previewNode =
       (SyntaxNode *)0x0;
  (pNVar6->name).kind = TVar2;
  (pNVar6->name).field_0x2 = uVar3;
  (pNVar6->name).numFlags = (NumericTokenFlags)NVar4.raw;
  (pNVar6->name).rawLen = uVar5;
  (pNVar6->name).info = pIVar1;
  return pNVar6;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }